

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saslclientio.c
# Opt level: O0

void on_sasl_frame_received_callback(void *context,AMQP_VALUE sasl_frame)

{
  _Bool _Var1;
  int iVar2;
  SASL_MECHANISMS_HANDLE pSVar3;
  SASL_CHALLENGE_HANDLE pSVar4;
  SASL_OUTCOME_HANDLE pSVar5;
  char *pcVar6;
  LOGGER_LOG p_Var7;
  SASL_MECHANISM_BYTES sasl_response;
  undefined8 in_stack_fffffffffffffe68;
  undefined4 uVar8;
  LOGGER_LOG l_19;
  LOGGER_LOG l_18;
  LOGGER_LOG l_17;
  LOGGER_LOG p_Stack_130;
  sasl_code sasl_code;
  LOGGER_LOG l_16;
  SASL_OUTCOME_HANDLE sasl_outcome;
  LOGGER_LOG l_15;
  LOGGER_LOG l_14;
  LOGGER_LOG l_13;
  SASL_MECHANISM_BYTES response_bytes;
  SASL_MECHANISM_BYTES challenge;
  LOGGER_LOG l_12;
  amqp_binary challenge_binary_value;
  LOGGER_LOG l_11;
  SASL_CHALLENGE_HANDLE sasl_challenge_handle;
  LOGGER_LOG l_10;
  LOGGER_LOG l_9;
  LOGGER_LOG l_8;
  LOGGER_LOG l_7;
  char *sasl_server_mechanism_name;
  LOGGER_LOG l_6;
  AMQP_VALUE sasl_server_mechanism;
  LOGGER_LOG p_Stack_80;
  uint32_t i;
  LOGGER_LOG l_5;
  char *sasl_mechanism_name;
  LOGGER_LOG l_4;
  AMQP_VALUE pAStack_60;
  uint32_t mechanisms_count;
  AMQP_VALUE sasl_server_mechanisms;
  LOGGER_LOG l_3;
  SASL_MECHANISMS_HANDLE sasl_mechanisms_handle;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  AMQP_VALUE descriptor;
  LOGGER_LOG l;
  SASL_CLIENT_IO_INSTANCE *sasl_client_io_instance;
  AMQP_VALUE sasl_frame_local;
  void *context_local;
  
  iVar2 = *(int *)((long)context + 0x68);
  l = (LOGGER_LOG)context;
  sasl_client_io_instance = (SASL_CLIENT_IO_INSTANCE *)sasl_frame;
  sasl_frame_local = (AMQP_VALUE)context;
  if (iVar2 != 1) {
    if (iVar2 == 2) {
      if (*(int *)((long)context + 0x48) != 4) {
        handle_error((SASL_CLIENT_IO_INSTANCE *)context);
        return;
      }
      l_1 = (LOGGER_LOG)amqpvalue_get_inplace_descriptor(sasl_frame);
      if ((AMQP_VALUE)l_1 == (AMQP_VALUE)0x0) {
        l_2 = xlogging_get_log_function();
        if (l_2 != (LOGGER_LOG)0x0) {
          (*l_2)(AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/saslclientio.c"
                 ,"on_sasl_frame_received_callback",0x2a4,1,"Could not obtain SASL frame descriptor"
                );
        }
        handle_error((SASL_CLIENT_IO_INSTANCE *)l);
        return;
      }
      if (((byte)l[0x78] & 1) != 0) {
        log_incoming_frame((AMQP_VALUE)sasl_client_io_instance);
      }
      _Var1 = is_sasl_mechanisms_type_by_descriptor((AMQP_VALUE)l_1);
      uVar8 = (undefined4)((ulong)in_stack_fffffffffffffe68 >> 0x20);
      if (!_Var1) {
        _Var1 = is_sasl_challenge_type_by_descriptor((AMQP_VALUE)l_1);
        if (_Var1) {
          if ((*(int *)(l + 0x4c) != 3) && (*(int *)(l + 0x4c) != 5)) {
            pSVar4 = (SASL_CHALLENGE_HANDLE)xlogging_get_log_function();
            sasl_challenge_handle = pSVar4;
            if (pSVar4 != (SASL_CHALLENGE_HANDLE)0x0) {
              pcVar6 = SASL_CLIENT_NEGOTIATION_STATEStrings
                                 (*(SASL_CLIENT_NEGOTIATION_STATE *)(l + 0x4c));
              (*(code *)pSVar4)(0,
                                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/saslclientio.c"
                                ,"on_sasl_frame_received_callback",0x327,1,
                                "SASL challenge received in a bad state: %s%s (%d)","",pcVar6,
                                *(undefined4 *)(l + 0x4c));
            }
            handle_error((SASL_CLIENT_IO_INSTANCE *)l);
            return;
          }
          iVar2 = amqpvalue_get_sasl_challenge
                            ((AMQP_VALUE)sasl_client_io_instance,(SASL_CHALLENGE_HANDLE *)&l_11);
          if (iVar2 != 0) {
            challenge_binary_value._8_8_ = xlogging_get_log_function();
            if ((LOGGER_LOG)challenge_binary_value._8_8_ != (LOGGER_LOG)0x0) {
              (*(code *)challenge_binary_value._8_8_)
                        (AZ_LOG_ERROR,
                         "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/saslclientio.c"
                         ,"on_sasl_frame_received_callback",0x331,1,
                         "Cannot get SASL challenge values");
            }
            handle_error((SASL_CLIENT_IO_INSTANCE *)l);
            return;
          }
          l_12 = (LOGGER_LOG)0x0;
          challenge_binary_value.bytes._0_4_ = 0;
          iVar2 = sasl_challenge_get_challenge((SASL_CHALLENGE_HANDLE)l_11,(amqp_binary *)&l_12);
          if (iVar2 == 0) {
            response_bytes._8_8_ = l_12;
            l_13 = (LOGGER_LOG)0x0;
            response_bytes.bytes._0_4_ = 0;
            iVar2 = saslmechanism_challenge
                              (*(SASL_MECHANISM_HANDLE *)(l + 0x70),
                               (SASL_MECHANISM_BYTES *)&response_bytes.length,
                               (SASL_MECHANISM_BYTES *)&l_13);
            if (iVar2 == 0) {
              sasl_response.length = response_bytes.bytes._0_4_;
              sasl_response.bytes = l_13;
              sasl_response._12_4_ = 0;
              iVar2 = send_sasl_response((SASL_CLIENT_IO_INSTANCE *)l,sasl_response);
              if (iVar2 != 0) {
                l_15 = xlogging_get_log_function();
                if (l_15 != (LOGGER_LOG)0x0) {
                  (*l_15)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/saslclientio.c"
                          ,"on_sasl_frame_received_callback",0x357,1,"Cannot send SASL response");
                }
                handle_error((SASL_CLIENT_IO_INSTANCE *)l);
              }
            }
            else {
              l_14 = xlogging_get_log_function();
              if (l_14 != (LOGGER_LOG)0x0) {
                (*l_14)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/saslclientio.c"
                        ,"on_sasl_frame_received_callback",0x351,1,"SASL Challenge failed");
              }
              handle_error((SASL_CLIENT_IO_INSTANCE *)l);
            }
          }
          else {
            p_Var7 = xlogging_get_log_function();
            if (p_Var7 != (LOGGER_LOG)0x0) {
              (*p_Var7)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/saslclientio.c"
                        ,"on_sasl_frame_received_callback",0x33f,1,
                        "Cannot get SASL challenge binary value");
            }
            handle_error((SASL_CLIENT_IO_INSTANCE *)l);
          }
          sasl_challenge_destroy((SASL_CHALLENGE_HANDLE)l_11);
          return;
        }
        _Var1 = is_sasl_outcome_type_by_descriptor((AMQP_VALUE)l_1);
        if (!_Var1) {
          p_Var7 = xlogging_get_log_function();
          if (p_Var7 == (LOGGER_LOG)0x0) {
            return;
          }
          (*p_Var7)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/saslclientio.c"
                    ,"on_sasl_frame_received_callback",0x3a2,1,"Bad SASL frame");
          return;
        }
        if ((*(int *)(l + 0x4c) != 3) && (*(int *)(l + 0x4c) != 5)) {
          pSVar5 = (SASL_OUTCOME_HANDLE)xlogging_get_log_function();
          sasl_outcome = pSVar5;
          if (pSVar5 != (SASL_OUTCOME_HANDLE)0x0) {
            pcVar6 = SASL_CLIENT_NEGOTIATION_STATEStrings
                               (*(SASL_CLIENT_NEGOTIATION_STATE *)(l + 0x4c));
            (*(code *)pSVar5)(0,
                              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/saslclientio.c"
                              ,"on_sasl_frame_received_callback",0x368,1,
                              "SASL outcome received in a bad state: %s%s (%d)","",pcVar6,
                              *(undefined4 *)(l + 0x4c));
          }
          handle_error((SASL_CLIENT_IO_INSTANCE *)l);
          return;
        }
        *(undefined4 *)(l + 0x4c) = 6;
        iVar2 = amqpvalue_get_sasl_outcome
                          ((AMQP_VALUE)sasl_client_io_instance,(SASL_OUTCOME_HANDLE *)&l_16);
        if (iVar2 != 0) {
          p_Stack_130 = xlogging_get_log_function();
          if (p_Stack_130 != (LOGGER_LOG)0x0) {
            (*p_Stack_130)(AZ_LOG_ERROR,
                           "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/saslclientio.c"
                           ,"on_sasl_frame_received_callback",0x373,1,"Cannot get SASL outcome");
          }
          handle_error((SASL_CLIENT_IO_INSTANCE *)l);
          return;
        }
        iVar2 = sasl_outcome_get_code((SASL_OUTCOME_HANDLE)l_16,(sasl_code *)((long)&l_17 + 7));
        if (iVar2 == 0) {
          if (l_17._7_1_ == 0) {
            *(undefined4 *)(l + 0x68) = 3;
            indicate_open_complete((SASL_CLIENT_IO_INSTANCE *)l,IO_OPEN_OK);
          }
          else {
            p_Var7 = xlogging_get_log_function();
            if (p_Var7 != (LOGGER_LOG)0x0) {
              (*p_Var7)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/saslclientio.c"
                        ,"on_sasl_frame_received_callback",0x38d,1,
                        "SASL handshake failed with code %02X",CONCAT44(uVar8,(uint)l_17._7_1_));
            }
            handle_error((SASL_CLIENT_IO_INSTANCE *)l);
          }
        }
        else {
          p_Var7 = xlogging_get_log_function();
          if (p_Var7 != (LOGGER_LOG)0x0) {
            (*p_Var7)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/saslclientio.c"
                      ,"on_sasl_frame_received_callback",0x37d,1,"Cannot get SASL outcome code");
          }
          handle_error((SASL_CLIENT_IO_INSTANCE *)l);
        }
        sasl_outcome_destroy((SASL_OUTCOME_HANDLE)l_16);
        return;
      }
      if (*(int *)(l + 0x4c) != 1) {
        pSVar3 = (SASL_MECHANISMS_HANDLE)xlogging_get_log_function();
        sasl_mechanisms_handle = pSVar3;
        if (pSVar3 != (SASL_MECHANISMS_HANDLE)0x0) {
          pcVar6 = SASL_CLIENT_NEGOTIATION_STATEStrings
                             (*(SASL_CLIENT_NEGOTIATION_STATE *)(l + 0x4c));
          (*(code *)pSVar3)(0,
                            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/saslclientio.c"
                            ,"on_sasl_frame_received_callback",0x2b6,1,
                            "SASL mechanisms frame received in %s%s (%d) state","",pcVar6,
                            *(undefined4 *)(l + 0x4c));
        }
        handle_error((SASL_CLIENT_IO_INSTANCE *)l);
        return;
      }
      iVar2 = amqpvalue_get_sasl_mechanisms
                        ((AMQP_VALUE)sasl_client_io_instance,(SASL_MECHANISMS_HANDLE *)&l_3);
      if (iVar2 != 0) {
        sasl_server_mechanisms = (AMQP_VALUE)xlogging_get_log_function();
        if (sasl_server_mechanisms != (AMQP_VALUE)0x0) {
          (*(code *)sasl_server_mechanisms)
                    (0,
                     "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/saslclientio.c"
                     ,"on_sasl_frame_received_callback",0x2c1,1,"Could not get SASL mechanisms");
        }
        handle_error((SASL_CLIENT_IO_INSTANCE *)l);
        return;
      }
      iVar2 = sasl_mechanisms_get_sasl_server_mechanisms
                        ((SASL_MECHANISMS_HANDLE)l_3,&stack0xffffffffffffffa0);
      if (((iVar2 == 0) &&
          (iVar2 = amqpvalue_get_array_item_count(pAStack_60,(uint32_t *)((long)&l_4 + 4)),
          iVar2 == 0)) && (l_4._4_4_ != 0)) {
        l_5 = (LOGGER_LOG)saslmechanism_get_mechanism_name(*(SASL_MECHANISM_HANDLE *)(l + 0x70));
        if (l_5 == (LOGGER_LOG)0x0) {
          p_Stack_80 = xlogging_get_log_function();
          if (p_Stack_80 != (LOGGER_LOG)0x0) {
            (*p_Stack_80)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/saslclientio.c"
                          ,"on_sasl_frame_received_callback",0x2d7,1,"Cannot get the mechanism name"
                         );
          }
          handle_error((SASL_CLIENT_IO_INSTANCE *)l);
        }
        else {
          for (sasl_server_mechanism._4_4_ = 0; sasl_server_mechanism._4_4_ < l_4._4_4_;
              sasl_server_mechanism._4_4_ = sasl_server_mechanism._4_4_ + 1) {
            l_6 = (LOGGER_LOG)amqpvalue_get_array_item(pAStack_60,sasl_server_mechanism._4_4_);
            if ((AMQP_VALUE)l_6 == (AMQP_VALUE)0x0) {
              sasl_server_mechanism_name = (char *)xlogging_get_log_function();
              if ((LOGGER_LOG)sasl_server_mechanism_name != (LOGGER_LOG)0x0) {
                in_stack_fffffffffffffe68 =
                     CONCAT44((int)((ulong)in_stack_fffffffffffffe68 >> 0x20),
                              sasl_server_mechanism._4_4_);
                (*(code *)sasl_server_mechanism_name)
                          (AZ_LOG_ERROR,
                           "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/saslclientio.c"
                           ,"on_sasl_frame_received_callback",0x2e4,1,
                           "Cannot get SASL mechanisms array item for index %u",
                           in_stack_fffffffffffffe68);
              }
              sasl_server_mechanism._4_4_ = l_4._4_4_;
            }
            else {
              iVar2 = amqpvalue_get_symbol((AMQP_VALUE)l_6,(char **)&l_7);
              if (iVar2 == 0) {
                iVar2 = strcmp((char *)l_5,(char *)l_7);
                if (iVar2 == 0) {
                  amqpvalue_destroy((AMQP_VALUE)l_6);
                  break;
                }
              }
              else {
                l_8 = xlogging_get_log_function();
                if (l_8 != (LOGGER_LOG)0x0) {
                  (*l_8)(AZ_LOG_ERROR,
                         "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/saslclientio.c"
                         ,"on_sasl_frame_received_callback",0x2ec,1,
                         "Error getting server SASL mechanism from array item");
                }
                sasl_server_mechanism._4_4_ = l_4._4_4_;
              }
              amqpvalue_destroy((AMQP_VALUE)l_6);
            }
          }
          if (sasl_server_mechanism._4_4_ == l_4._4_4_) {
            l_9 = xlogging_get_log_function();
            if (l_9 != (LOGGER_LOG)0x0) {
              (*l_9)(AZ_LOG_ERROR,
                     "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/saslclientio.c"
                     ,"on_sasl_frame_received_callback",0x2ff,1,
                     "Could not find desired SASL mechanism in the list presented by server");
            }
            handle_error((SASL_CLIENT_IO_INSTANCE *)l);
          }
          else {
            *(undefined4 *)(l + 0x4c) = 2;
            iVar2 = send_sasl_init((SASL_CLIENT_IO_INSTANCE *)l,(char *)l_5);
            if (iVar2 == 0) {
              *(undefined4 *)(l + 0x4c) = 3;
            }
            else {
              l_10 = xlogging_get_log_function();
              if (l_10 != (LOGGER_LOG)0x0) {
                (*l_10)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/saslclientio.c"
                        ,"on_sasl_frame_received_callback",0x30c,1,"Could not send SASL init");
              }
              handle_error((SASL_CLIENT_IO_INSTANCE *)l);
            }
          }
        }
      }
      else {
        sasl_mechanism_name = (char *)xlogging_get_log_function();
        if ((LOGGER_LOG)sasl_mechanism_name != (LOGGER_LOG)0x0) {
          (*(code *)sasl_mechanism_name)
                    (AZ_LOG_ERROR,
                     "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/saslclientio.c"
                     ,"on_sasl_frame_received_callback",0x2ce,1,"Invalid SASL mechanisms list");
        }
        handle_error((SASL_CLIENT_IO_INSTANCE *)l);
      }
      sasl_mechanisms_destroy((SASL_MECHANISMS_HANDLE)l_3);
      return;
    }
    if (1 < iVar2 - 3U) {
      descriptor = (AMQP_VALUE)xlogging_get_log_function();
      if (descriptor == (AMQP_VALUE)0x0) {
        return;
      }
      (*(code *)descriptor)
                (0,
                 "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/saslclientio.c"
                 ,"on_sasl_frame_received_callback",0x28e,1,"SASL frame received while in state %d",
                 *(undefined4 *)(l + 0x68));
      return;
    }
  }
  handle_error((SASL_CLIENT_IO_INSTANCE *)context);
  return;
}

Assistant:

static void on_sasl_frame_received_callback(void* context, AMQP_VALUE sasl_frame)
{
    SASL_CLIENT_IO_INSTANCE* sasl_client_io_instance = (SASL_CLIENT_IO_INSTANCE*)context;

    /* Codes_SRS_SASLCLIENTIO_01_067: [The SASL frame exchange shall be started as soon as the SASL header handshake is done.] */
    switch (sasl_client_io_instance->io_state)
    {
    default:
        LogError("SASL frame received while in state %d", (int)sasl_client_io_instance->io_state);
        break;

    case IO_STATE_OPEN:
    case IO_STATE_OPENING_UNDERLYING_IO:
    case IO_STATE_CLOSING:
        /* Codes_SRS_SASLCLIENTIO_01_117: [If `on_sasl_frame_received_callback` is called when the state of the IO is OPEN then the `on_io_error` callback shall be triggered.]*/
        handle_error(sasl_client_io_instance);
        break;

    case IO_STATE_SASL_HANDSHAKE:
        if (sasl_client_io_instance->sasl_header_exchange_state != SASL_HEADER_EXCHANGE_HEADER_EXCH)
        {
            /* Codes_SRS_SASLCLIENTIO_01_118: [If `on_sasl_frame_received_callback` is called in the OPENING state but the header exchange has not yet been completed, then the `on_io_error` callback shall be triggered.]*/
            handle_error(sasl_client_io_instance);
        }
        else
        {
            AMQP_VALUE descriptor = amqpvalue_get_inplace_descriptor(sasl_frame);
            if (descriptor == NULL)
            {
                /* Codes_SRS_SASLCLIENTIO_01_119: [If any error is encountered when parsing the received frame, the `on_io_open_complete` callback shall be triggered with `IO_OPEN_ERROR`.]*/
                LogError("Could not obtain SASL frame descriptor");
                handle_error(sasl_client_io_instance);
            }
            else
            {
                if (sasl_client_io_instance->is_trace_on != 0)
                {
                    log_incoming_frame(sasl_frame);
                }

                /* Codes_SRS_SASLCLIENTIO_01_032: [The peer acting as the SASL server MUST announce supported authentication mechanisms using the sasl-mechanisms frame.] */
                /* Codes_SRS_SASLCLIENTIO_01_040: [The peer playing the role of the SASL client and the peer playing the role of the SASL server MUST correspond to the TCP client and server respectively.] */
                /* Codes_SRS_SASLCLIENTIO_01_034: [<-- SASL-MECHANISMS] */
                if (is_sasl_mechanisms_type_by_descriptor(descriptor))
                {
                    switch (sasl_client_io_instance->sasl_client_negotiation_state)
                    {
                    default:
                        LogError("SASL mechanisms frame received in %" PRI_MU_ENUM " state", MU_ENUM_VALUE(SASL_CLIENT_NEGOTIATION_STATE, sasl_client_io_instance->sasl_client_negotiation_state));
                        handle_error(sasl_client_io_instance);
                        break;

                    case SASL_CLIENT_NEGOTIATION_NOT_STARTED:
                    {
                        SASL_MECHANISMS_HANDLE sasl_mechanisms_handle;

                        if (amqpvalue_get_sasl_mechanisms(sasl_frame, &sasl_mechanisms_handle) != 0)
                        {
                            /* Codes_SRS_SASLCLIENTIO_01_119: [If any error is encountered when parsing the received frame, the `on_io_open_complete` callback shall be triggered with `IO_OPEN_ERROR`.]*/
                            LogError("Could not get SASL mechanisms");
                            handle_error(sasl_client_io_instance);
                        }
                        else
                        {
                            AMQP_VALUE sasl_server_mechanisms;
                            uint32_t mechanisms_count;

                            if ((sasl_mechanisms_get_sasl_server_mechanisms(sasl_mechanisms_handle, &sasl_server_mechanisms) != 0) ||
                                (amqpvalue_get_array_item_count(sasl_server_mechanisms, &mechanisms_count) != 0) ||
                                (mechanisms_count == 0))
                            {
                                /* Codes_SRS_SASLCLIENTIO_01_042: [It is invalid for this list to be null or empty.] */
                                LogError("Invalid SASL mechanisms list");
                                handle_error(sasl_client_io_instance);
                            }
                            else
                            {
                                const char* sasl_mechanism_name = saslmechanism_get_mechanism_name(sasl_client_io_instance->sasl_mechanism);
                                if (sasl_mechanism_name == NULL)
                                {
                                    /* Codes_SRS_SASLCLIENTIO_01_119: [If any error is encountered when parsing the received frame, the `on_io_open_complete` callback shall be triggered with `IO_OPEN_ERROR`.]*/
                                    LogError("Cannot get the mechanism name");
                                    handle_error(sasl_client_io_instance);
                                }
                                else
                                {
                                    uint32_t i;

                                    for (i = 0; i < mechanisms_count; i++)
                                    {
                                        AMQP_VALUE sasl_server_mechanism;
                                        sasl_server_mechanism = amqpvalue_get_array_item(sasl_server_mechanisms, i);
                                        if (sasl_server_mechanism == NULL)
                                        {
                                            LogError("Cannot get SASL mechanisms array item for index %u", (unsigned int)i);
                                            i = mechanisms_count;
                                        }
                                        else
                                        {
                                            const char* sasl_server_mechanism_name;
                                            if (amqpvalue_get_symbol(sasl_server_mechanism, &sasl_server_mechanism_name) != 0)
                                            {
                                                LogError("Error getting server SASL mechanism from array item");
                                                i = mechanisms_count;
                                            }
                                            else
                                            {
                                                if (strcmp(sasl_mechanism_name, sasl_server_mechanism_name) == 0)
                                                {
                                                    amqpvalue_destroy(sasl_server_mechanism);
                                                    break;
                                                }
                                            }

                                            amqpvalue_destroy(sasl_server_mechanism);
                                        }
                                    }

                                    if (i == mechanisms_count)
                                    {
                                        /* Codes_SRS_SASLCLIENTIO_01_119: [If any error is encountered when parsing the received frame, the `on_io_open_complete` callback shall be triggered with `IO_OPEN_ERROR`.]*/
                                        LogError("Could not find desired SASL mechanism in the list presented by server");
                                        handle_error(sasl_client_io_instance);
                                    }
                                    else
                                    {
                                        sasl_client_io_instance->sasl_client_negotiation_state = SASL_CLIENT_NEGOTIATION_MECH_RCVD;

                                        /* Codes_SRS_SASLCLIENTIO_01_035: [SASL-INIT -->] */
                                        /* Codes_SRS_SASLCLIENTIO_01_033: [The partner MUST then choose one of the supported mechanisms and initiate a sasl exchange.] */
                                        /* Codes_SRS_SASLCLIENTIO_01_054: [Selects the sasl mechanism and provides the initial response if needed.] */
                                        if (send_sasl_init(sasl_client_io_instance, sasl_mechanism_name) != 0)
                                        {
                                            /* Codes_SRS_SASLCLIENTIO_01_119: [If any error is encountered when parsing the received frame, the `on_io_open_complete` callback shall be triggered with `IO_OPEN_ERROR`.]*/
                                            LogError("Could not send SASL init");
                                            handle_error(sasl_client_io_instance);
                                        }
                                        else
                                        {
                                            sasl_client_io_instance->sasl_client_negotiation_state = SASL_CLIENT_NEGOTIATION_INIT_SENT;
                                        }
                                    }
                                }
                            }

                            sasl_mechanisms_destroy(sasl_mechanisms_handle);
                        }

                        break;
                    }
                    }
                }
                /* Codes_SRS_SASLCLIENTIO_01_052: [Send the SASL challenge data as defined by the SASL specification.] */
                /* Codes_SRS_SASLCLIENTIO_01_036: [<-- SASL-CHALLENGE *] */
                /* Codes_SRS_SASLCLIENTIO_01_039: [the SASL challenge/response step can occur zero or more times depending on the details of the SASL mechanism chosen.] */
                else if (is_sasl_challenge_type_by_descriptor(descriptor))
                {
                    /* Codes_SRS_SASLCLIENTIO_01_032: [The peer acting as the SASL server MUST announce supported authentication mechanisms using the sasl-mechanisms frame.] */
                    if ((sasl_client_io_instance->sasl_client_negotiation_state != SASL_CLIENT_NEGOTIATION_INIT_SENT) &&
                        (sasl_client_io_instance->sasl_client_negotiation_state != SASL_CLIENT_NEGOTIATION_RESPONSE_SENT))
                    {
                        LogError("SASL challenge received in a bad state: %" PRI_MU_ENUM "", MU_ENUM_VALUE(SASL_CLIENT_NEGOTIATION_STATE, sasl_client_io_instance->sasl_client_negotiation_state));
                        handle_error(sasl_client_io_instance);
                    }
                    else
                    {
                        SASL_CHALLENGE_HANDLE sasl_challenge_handle;

                        if (amqpvalue_get_sasl_challenge(sasl_frame, &sasl_challenge_handle) != 0)
                        {
                            /* Codes_SRS_SASLCLIENTIO_01_119: [If any error is encountered when parsing the received frame, the `on_io_open_complete` callback shall be triggered with `IO_OPEN_ERROR`.]*/
                            LogError("Cannot get SASL challenge values");
                            handle_error(sasl_client_io_instance);
                        }
                        else
                        {
                            amqp_binary challenge_binary_value;

                            challenge_binary_value.bytes = NULL;
                            challenge_binary_value.length = 0;

                            /* Codes_SRS_SASLCLIENTIO_01_053: [Challenge information, a block of opaque binary data passed to the security mechanism.] */
                            if (sasl_challenge_get_challenge(sasl_challenge_handle, &challenge_binary_value) != 0)
                            {
                                /* Codes_SRS_SASLCLIENTIO_01_119: [If any error is encountered when parsing the received frame, the `on_io_open_complete` callback shall be triggered with `IO_OPEN_ERROR`.]*/
                                LogError("Cannot get SASL challenge binary value");
                                handle_error(sasl_client_io_instance);
                            }
                            else
                            {
                                SASL_MECHANISM_BYTES challenge;
                                SASL_MECHANISM_BYTES response_bytes;

                                challenge.bytes = challenge_binary_value.bytes;
                                challenge.length = challenge_binary_value.length;
                                response_bytes.bytes = NULL;
                                response_bytes.length = 0;

                                /* Codes_SRS_SASLCLIENTIO_01_057: [The contents of this data are defined by the SASL security mechanism.] */
                                /* Codes_SRS_SASLCLIENTIO_01_037: [SASL-RESPONSE -->] */
                                if (saslmechanism_challenge(sasl_client_io_instance->sasl_mechanism, &challenge, &response_bytes) != 0)
                                {
                                    /* Codes_SRS_SASLCLIENTIO_01_119: [If any error is encountered when parsing the received frame, the `on_io_open_complete` callback shall be triggered with `IO_OPEN_ERROR`.]*/
                                    LogError("SASL Challenge failed");
                                    handle_error(sasl_client_io_instance);
                                }
                                else if (send_sasl_response(sasl_client_io_instance, response_bytes) != 0)
                                {
                                    /* Codes_SRS_SASLCLIENTIO_01_119: [If any error is encountered when parsing the received frame, the `on_io_open_complete` callback shall be triggered with `IO_OPEN_ERROR`.]*/
                                    LogError("Cannot send SASL response");
                                    handle_error(sasl_client_io_instance);
                                }
                            }

                            sasl_challenge_destroy(sasl_challenge_handle);
                        }
                    }
                }
                /* Codes_SRS_SASLCLIENTIO_01_058: [This frame indicates the outcome of the SASL dialog.] */
                /* Codes_SRS_SASLCLIENTIO_01_038: [<-- SASL-OUTCOME] */
                else if (is_sasl_outcome_type_by_descriptor(descriptor))
                {
                    /* Codes_SRS_SASLCLIENTIO_01_032: [The peer acting as the SASL server MUST announce supported authentication mechanisms using the sasl-mechanisms frame.] */
                    if ((sasl_client_io_instance->sasl_client_negotiation_state != SASL_CLIENT_NEGOTIATION_INIT_SENT) &&
                        (sasl_client_io_instance->sasl_client_negotiation_state != SASL_CLIENT_NEGOTIATION_RESPONSE_SENT))
                    {
                        LogError("SASL outcome received in a bad state: %" PRI_MU_ENUM "", MU_ENUM_VALUE(SASL_CLIENT_NEGOTIATION_STATE, sasl_client_io_instance->sasl_client_negotiation_state));
                        handle_error(sasl_client_io_instance);
                    }
                    else
                    {
                        SASL_OUTCOME_HANDLE sasl_outcome;

                        sasl_client_io_instance->sasl_client_negotiation_state = SASL_CLIENT_NEGOTIATION_OUTCOME_RCVD;

                        if (amqpvalue_get_sasl_outcome(sasl_frame, &sasl_outcome) != 0)
                        {
                            LogError("Cannot get SASL outcome");
                            handle_error(sasl_client_io_instance);
                        }
                        else
                        {
                            sasl_code sasl_code;

                            /* Codes_SRS_SASLCLIENTIO_01_060: [A reply-code indicating the outcome of the SASL dialog.] */
                            if (sasl_outcome_get_code(sasl_outcome, &sasl_code) != 0)
                            {
                                LogError("Cannot get SASL outcome code");
                                handle_error(sasl_client_io_instance);
                            }
                            else
                            {
                                switch (sasl_code)
                                {
                                default:
                                case sasl_code_auth:
                                    /* Codes_SRS_SASLCLIENTIO_01_063: [1 Connection authentication failed due to an unspecified problem with the supplied credentials.] */
                                case sasl_code_sys:
                                    /* Codes_SRS_SASLCLIENTIO_01_064: [2 Connection authentication failed due to a system error.] */
                                case sasl_code_sys_perm:
                                    /* Codes_SRS_SASLCLIENTIO_01_065: [3 Connection authentication failed due to a system error that is unlikely to be corrected without intervention.] */
                                case sasl_code_sys_temp:
                                    /* Codes_SRS_SASLCLIENTIO_01_066: [4 Connection authentication failed due to a transient system error.] */
                                    LogError("SASL handshake failed with code %02X", (unsigned char)sasl_code);
                                    handle_error(sasl_client_io_instance);
                                    break;

                                case sasl_code_ok:
                                    /* Codes_SRS_SASLCLIENTIO_01_059: [Upon successful completion of the SASL dialog the security layer has been established] */
                                    /* Codes_SRS_SASLCLIENTIO_01_062: [0 Connection authentication succeeded.]  */
                                    sasl_client_io_instance->io_state = IO_STATE_OPEN;

                                    /* Codes_SRS_SASLCLIENTIO_01_072: [When the SASL handshake is complete, if the handshake is successful, the SASL client IO state shall be switched to `IO_STATE_OPEN` and the `on_io_open_complete` callback shall be called with `IO_OPEN_OK`.]*/
                                    indicate_open_complete(sasl_client_io_instance, IO_OPEN_OK);
                                    break;
                                }
                            }

                            sasl_outcome_destroy(sasl_outcome);
                        }
                    }
                }
                else
                {
                    LogError("Bad SASL frame");
                }
            }
        }
        break;
    }
}